

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

ZSTD_compressionParameters *
ZSTD_getCParams_internal
          (ZSTD_compressionParameters *__return_storage_ptr__,int compressionLevel,
          unsigned_long_long srcSizeHint,size_t dictSize)

{
  ZSTD_compressionParameters *pZVar1;
  undefined4 uVar2;
  ZSTD_compressionParameters cPar;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  undefined4 uStack_1c;
  
  uVar7 = 0xffffffffffffffff;
  if (srcSizeHint != 0xffffffffffffffff || dictSize != 0) {
    lVar10 = 500;
    if (dictSize == 0) {
      lVar10 = 0;
    }
    lVar8 = 0;
    if (srcSizeHint == 0xffffffffffffffff) {
      lVar8 = lVar10;
    }
    uVar7 = lVar8 + dictSize + srcSizeHint;
  }
  lVar10 = (ulong)(uVar7 < 0x20001) + (ulong)(uVar7 < 0x40001) + (ulong)(uVar7 < 0x4001);
  iVar9 = 3;
  if (compressionLevel != 0) {
    iVar9 = compressionLevel;
  }
  if (compressionLevel < 0) {
    iVar9 = 0;
  }
  iVar6 = 0x16;
  if (compressionLevel < 0x17) {
    iVar6 = iVar9;
  }
  lVar8 = (long)iVar6 * 0x1c;
  lVar11 = lVar10 * 0x284;
  pZVar1 = ZSTD_defaultCParameters[lVar10] + iVar6;
  uVar2 = pZVar1->searchLog;
  uVar3 = pZVar1->windowLog;
  uVar4 = pZVar1->chainLog;
  uVar5 = pZVar1->hashLog;
  cPar.hashLog = uVar5;
  cPar.chainLog = uVar4;
  cPar.windowLog = uVar3;
  if (compressionLevel < 0) {
    iVar9 = -compressionLevel;
  }
  else {
    iVar9 = *(int *)(lVar11 + 0x1a0664 + lVar8);
  }
  cPar.strategy = *(undefined4 *)(lVar11 + 0x1a0668 + lVar8);
  cPar.targetLength = iVar9;
  cPar.searchLog = uVar2;
  cPar.minMatch = *(undefined4 *)(lVar11 + 0x1a0660 + lVar8);
  ZSTD_adjustCParams_internal(__return_storage_ptr__,cPar,srcSizeHint,dictSize);
  return __return_storage_ptr__;
}

Assistant:

static ZSTD_compressionParameters ZSTD_getCParams_internal(int compressionLevel, unsigned long long srcSizeHint, size_t dictSize)
{
    int const unknown = srcSizeHint == ZSTD_CONTENTSIZE_UNKNOWN;
    size_t const addedSize = unknown && dictSize > 0 ? 500 : 0;
    U64 const rSize = unknown && dictSize == 0 ? ZSTD_CONTENTSIZE_UNKNOWN : srcSizeHint+dictSize+addedSize;
    U32 const tableID = (rSize <= 256 KB) + (rSize <= 128 KB) + (rSize <= 16 KB);
    int row = compressionLevel;
    DEBUGLOG(5, "ZSTD_getCParams_internal (cLevel=%i)", compressionLevel);
    if (compressionLevel == 0) row = ZSTD_CLEVEL_DEFAULT;   /* 0 == default */
    if (compressionLevel < 0) row = 0;   /* entry 0 is baseline for fast mode */
    if (compressionLevel > ZSTD_MAX_CLEVEL) row = ZSTD_MAX_CLEVEL;
    {   ZSTD_compressionParameters cp = ZSTD_defaultCParameters[tableID][row];
        if (compressionLevel < 0) cp.targetLength = (unsigned)(-compressionLevel);   /* acceleration factor */
        /* refine parameters based on srcSize & dictSize */
        return ZSTD_adjustCParams_internal(cp, srcSizeHint, dictSize);
    }
}